

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O3

Array<unsigned_char> *
kj::anon_unknown_65::readAll
          (Array<unsigned_char> *__return_storage_ptr__,InputStream *input,uint64_t limit,
          bool nulTerminate)

{
  Array<unsigned_char> *pAVar1;
  RemoveConst<kj::Array<unsigned_char>_> *pRVar2;
  Array<unsigned_char> *pAVar3;
  Fault FVar4;
  ulong uVar5;
  int iVar6;
  Exception *__src;
  undefined4 extraout_var;
  uchar *puVar8;
  Array<unsigned_char> *pAVar9;
  undefined7 in_register_00000009;
  uchar *puVar10;
  size_t sVar11;
  ulong elementCount;
  Array<unsigned_char> *p;
  Vector<kj::Array<unsigned_char>_> parts;
  Fault f;
  Fault f_1;
  Vector<kj::Array<unsigned_char>_> local_c8;
  Array<unsigned_char> *local_a8;
  undefined4 local_9c;
  Fault local_98;
  ulong uStack_90;
  undefined8 *local_88;
  ulong local_78;
  Fault local_70;
  InputStream *local_68;
  ulong local_60;
  uchar *local_58;
  ulong local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong uVar7;
  
  local_c8.builder.ptr = (Array<unsigned_char> *)0x0;
  local_c8.builder.pos = (Array<unsigned_char> *)0x0;
  local_c8.builder.endPtr = (Array<unsigned_char> *)0x0;
  local_9c = (undefined4)CONCAT71(in_register_00000009,nulTerminate);
  local_60 = CONCAT71(in_register_00000009,nulTerminate) & 0xffffffff;
  local_a8 = __return_storage_ptr__;
  local_68 = input;
  do {
    if (limit == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                (&local_98,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                 ,0x4e,FAILED,"limit > 0","\"Reached limit before EOF.\"",
                 (char (*) [26])"Reached limit before EOF.");
      _::Debug::Fault::fatal(&local_98);
    }
    elementCount = 0x1000;
    if (limit < 0x1000) {
      elementCount = limit;
    }
    __src = (Exception *)
            _::HeapArrayDisposer::allocateImpl
                      (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                       (_func_void_void_ptr *)0x0);
    local_88 = &_::HeapArrayDisposer::instance;
    local_98.exception = __src;
    uStack_90 = elementCount;
    iVar6 = (*input->_vptr_InputStream[2])(input,__src,elementCount);
    uVar7 = CONCAT44(extraout_var,iVar6);
    if (uVar7 < elementCount) {
      sVar11 = ((ulong)((long)local_c8.builder.pos - (long)local_c8.builder.ptr) >> 3) *
               -0x5555555555555000 + local_60 + uVar7;
      local_78 = uVar7;
      puVar8 = (uchar *)_::HeapArrayDisposer::allocateImpl
                                  (1,sVar11,sVar11,(_func_void_void_ptr *)0x0,
                                   (_func_void_void_ptr *)0x0);
      pRVar2 = local_c8.builder.pos;
      local_a8->ptr = puVar8;
      local_a8->size_ = sVar11;
      local_a8->disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_58 = puVar8;
      local_50 = limit;
      for (pAVar9 = local_c8.builder.ptr; uVar7 = local_78, pAVar9 != pRVar2; pAVar9 = pAVar9 + 1) {
        memcpy(puVar8,pAVar9->ptr,0x1000);
        puVar8 = puVar8 + 0x1000;
      }
      pAVar9 = (Array<unsigned_char> *)memcpy(puVar8,__src,local_78);
      limit = local_50;
      input = local_68;
      uVar5 = uStack_90;
      FVar4.exception = local_98.exception;
      puVar8 = puVar8 + uVar7;
      puVar10 = local_58;
      if ((char)local_9c != '\0') {
        *puVar8 = '\0';
        puVar8 = puVar8 + 1;
        sVar11 = local_a8->size_;
        pAVar9 = local_a8;
        puVar10 = local_a8->ptr;
      }
      if (puVar8 != puVar10 + sVar11) {
        local_70.exception = (Exception *)0x0;
        local_48 = 0;
        uStack_40 = 0;
        _::Debug::Fault::init
                  (&local_70,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                  );
        _::Debug::Fault::fatal(&local_70);
      }
      if (local_98.exception != (Exception *)0x0) {
        local_98.exception = (Exception *)0x0;
        uStack_90 = 0;
        pAVar9 = (Array<unsigned_char> *)
                 (**(code **)*local_88)(local_88,FVar4.exception,1,uVar5,uVar5,0);
        uVar7 = local_78;
      }
    }
    else {
      if (local_c8.builder.pos == local_c8.builder.endPtr) {
        sVar11 = ((long)local_c8.builder.pos - (long)local_c8.builder.ptr >> 3) * 0x5555555555555556
        ;
        if (local_c8.builder.pos == local_c8.builder.ptr) {
          sVar11 = 4;
        }
        Vector<kj::Array<unsigned_char>_>::setCapacity(&local_c8,sVar11);
      }
      (local_c8.builder.pos)->ptr = (uchar *)__src;
      (local_c8.builder.pos)->size_ = elementCount;
      pAVar9 = (Array<unsigned_char> *)&_::HeapArrayDisposer::instance;
      (local_c8.builder.pos)->disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_c8.builder.pos = local_c8.builder.pos + 1;
    }
    pAVar3 = local_c8.builder.endPtr;
    pRVar2 = local_c8.builder.pos;
    pAVar1 = local_c8.builder.ptr;
    limit = limit - uVar7;
    if (uVar7 < elementCount) {
      if (local_c8.builder.ptr != (Array<unsigned_char> *)0x0) {
        local_c8.builder.ptr = (Array<unsigned_char> *)0x0;
        local_c8.builder.pos = (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
        local_c8.builder.endPtr = (Array<unsigned_char> *)0x0;
        pAVar9 = (Array<unsigned_char> *)
                 (*(code *)**(undefined8 **)local_c8.builder.disposer)
                           (local_c8.builder.disposer,pAVar1,0x18,
                            ((long)pRVar2 - (long)pAVar1 >> 3) * -0x5555555555555555,
                            ((long)pAVar3 - (long)pAVar1 >> 3) * -0x5555555555555555,
                            ArrayDisposer::Dispose_<kj::Array<unsigned_char>,_false>::destruct);
      }
      return pAVar9;
    }
  } while( true );
}

Assistant:

Array<byte> readAll(InputStream& input, uint64_t limit, bool nulTerminate) {
  Vector<Array<byte>> parts;
  constexpr size_t BLOCK_SIZE = 4096;

  for (;;) {
    KJ_REQUIRE(limit > 0, "Reached limit before EOF.");
    auto part = heapArray<byte>(kj::min(BLOCK_SIZE, limit));
    size_t n = input.tryRead(part.begin(), part.size(), part.size());
    limit -= n;
    if (n < part.size()) {
      auto result = heapArray<byte>(parts.size() * BLOCK_SIZE + n + nulTerminate);
      byte* pos = result.begin();
      for (auto& p: parts) {
        memcpy(pos, p.begin(), BLOCK_SIZE);
        pos += BLOCK_SIZE;
      }
      memcpy(pos, part.begin(), n);
      pos += n;
      if (nulTerminate) *pos++ = '\0';
      KJ_ASSERT(pos == result.end());
      return result;
    } else {
      parts.add(kj::mv(part));
    }
  }
}